

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_INT ref_subdiv_map(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT cell)

{
  REF_INT *pRVar1;
  REF_INT RVar2;
  int local_28;
  int local_24;
  REF_INT bit;
  REF_INT map;
  REF_INT edge;
  REF_INT cell_local;
  REF_CELL ref_cell_local;
  REF_SUBDIV ref_subdiv_local;
  
  local_24 = 0;
  local_28 = 1;
  for (bit = 0; bit < ref_cell->edge_per; bit = bit + 1) {
    pRVar1 = ref_subdiv->mark;
    RVar2 = ref_subdiv_c2e(ref_subdiv,ref_cell,bit,cell);
    local_24 = local_28 * pRVar1[RVar2] + local_24;
    local_28 = local_28 << 1;
  }
  return local_24;
}

Assistant:

static REF_INT ref_subdiv_map(REF_SUBDIV ref_subdiv, REF_CELL ref_cell,
                              REF_INT cell) {
  REF_INT edge, map, bit;

  map = 0;
  bit = 1;
  for (edge = 0; edge < ref_cell_edge_per(ref_cell); edge++) {
    map +=
        bit * ref_subdiv_mark(ref_subdiv,
                              ref_subdiv_c2e(ref_subdiv, ref_cell, edge, cell));
    bit *= 2;
  }

  return map;
}